

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typename.cpp
# Opt level: O2

void __thiscall
enact::ReferenceTypename::ReferenceTypename(ReferenceTypename *this,ReferenceTypename *typename_)

{
  Typename *local_90;
  _Head_base<0UL,_const_enact::Typename_*,_false> local_88;
  _Optional_payload_base<enact::Token> local_80;
  _Optional_payload_base<enact::Token> local_48;
  
  std::_Optional_base<enact::Token,_false,_false>::_Optional_base
            ((_Optional_base<enact::Token,_false,_false> *)&local_48,
             &(typename_->m_permission).super__Optional_base<enact::Token,_false,_false>);
  std::_Optional_base<enact::Token,_false,_false>::_Optional_base
            ((_Optional_base<enact::Token,_false,_false> *)&local_80,
             &(typename_->m_region).super__Optional_base<enact::Token,_false,_false>);
  (*((typename_->m_referringTypename)._M_t.
     super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>._M_t.
     super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>.
     super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl)->_vptr_Typename[2])
            (&local_90);
  local_88._M_head_impl = local_90;
  local_90 = (Typename *)0x0;
  ReferenceTypename(this,(optional<enact::Token> *)&local_48,(optional<enact::Token> *)&local_80,
                    (unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
                     *)&local_88);
  if (local_88._M_head_impl != (Typename *)0x0) {
    (*(local_88._M_head_impl)->_vptr_Typename[1])();
  }
  if (local_90 != (Typename *)0x0) {
    (*local_90->_vptr_Typename[1])();
  }
  std::_Optional_payload_base<enact::Token>::_M_reset(&local_80);
  std::_Optional_payload_base<enact::Token>::_M_reset(&local_48);
  return;
}

Assistant:

ReferenceTypename::ReferenceTypename(const ReferenceTypename& typename_) :
            ReferenceTypename{
                    typename_.m_permission,
                    typename_.m_region,
                    typename_.m_referringTypename->clone()} {
    }